

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_intlog.cpp
# Opt level: O0

void __thiscall
bitmanip::anon_unknown_0::Test_intlog_log10floor_approximate_table_::run
          (Test_intlog_log10floor_approximate_table_ *this)

{
  SourceLocation loc;
  bool bVar1;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_158;
  undefined1 local_136;
  undefined1 local_135;
  undefined1 local_121;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string_view local_80;
  undefined4 local_6c;
  undefined8 *puStack_68;
  Cmp cmp_;
  uint64_t *tr_;
  uint64_t **local_58;
  uint64_t *tl_;
  Table<unsigned_char,_64UL> table;
  Test_intlog_log10floor_approximate_table_ *this_local;
  
  table.data._56_8_ = this;
  memcpy(&tl_,&DAT_002cceb5,0x40);
  tr_ = (uint64_t *)detail::approximateGuessTable<64ul>((Table<unsigned_char,_64UL> *)&tl_);
  local_58 = &tr_;
  puStack_68 = &detail::NO_APPROXIMATION;
  local_6c = 1;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)1,unsigned_long,unsigned_long>
                    ((unsigned_long *)local_58,&detail::NO_APPROXIMATION);
  local_121 = 0;
  local_135 = 0;
  local_136 = 0;
  if (!bVar1) {
    stringify<unsigned_long>(&local_120,(unsigned_long *)local_58);
    local_121 = 1;
    std::operator+(&local_100,
                   "Comparison failed: detail::approximateGuessTable(table) != detail::NO_APPROXIMATION (with \"detail::approximateGuessTable(table)\"="
                   ,&local_120);
    local_135 = 1;
    std::operator+(&local_e0,&local_100,", \"detail::NO_APPROXIMATION\"=");
    local_136 = 1;
    stringify<unsigned_long>(&local_158,&detail::NO_APPROXIMATION);
    std::operator+(&local_c0,&local_e0,&local_158);
    std::operator+(&local_a0,&local_c0,")");
    local_80 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a0);
    loc.function = "run";
    loc.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc.line = 0x2f;
    assertFail(local_80,loc);
  }
  return;
}

Assistant:

BITMANIP_TEST(intlog, log10floor_approximate_table)
{
    auto table = detail::makeGuessTable<std::uint64_t, 10>();
    BITMANIP_ASSERT_NE(detail::approximateGuessTable(table), detail::NO_APPROXIMATION);
}